

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void onpayload(uint8_t *data,uint32_t sz,i2cp_state *st,void *user)

{
  _Bool _Var1;
  uint uVar2;
  uint16_t ippkt_sz;
  uint16_t local_1a;
  
  if ((ushort)(*(ushort *)data << 8 | *(ushort *)data >> 8) != st->sid) {
    __assert_fail("sid == st->sid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/main.c"
                  ,0x86,"void onpayload(uint8_t *, uint32_t, struct i2cp_state *, void *)");
  }
  uVar2 = *(uint *)(data + 6);
  uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  *(uint *)((long)user + 0x421c48) = uVar2;
  if (sz < uVar2) {
    printf("i2cp payload overflow: %d > %d\n",(ulong)uVar2,sz);
    return;
  }
  *(uint8_t **)((long)user + 0x421c40) = data + 10;
  _Var1 = i2cp_parse_payload((i2cp_payload *)((long)user + 0x411bc0));
  if (_Var1) {
    _Var1 = translate_i2cp_to_ip
                      ((packet_state *)((long)user + 0x421c50),
                       (i2cp_payload *)((long)user + 0x411bc0),(uint8_t *)((long)user + 0x743610),
                       0x10000,&local_1a);
    if (_Var1) {
      ringbuf_append((ringbuf *)((long)user + 0x5c35dc),(uint8_t *)((long)user + 0x743610),local_1a)
      ;
    }
    else {
      puts("dropping i2cp message, cannot translate");
    }
    return;
  }
  puts("invalid i2cp payload");
  return;
}

Assistant:

void onpayload(uint8_t * data, uint32_t sz, struct i2cp_state * st, void * user)
{
  struct trans2p * t = user;
  uint8_t * buf = data;
  // session id
  uint16_t sid = bufbe16toh(buf);
  buf += 2;
  assert(sid == st->sid);
  // msgid
  buf += 4;
  // payload header
  t->payload.ptrlen = bufbe32toh(buf);
  if(t->payload.ptrlen > sz)
  {
    printf("i2cp payload overflow: %d > %d\n", t->payload.ptrlen, sz);
    return;
  }
  buf += 4;
  // payload 
  t->payload.ptr = buf;
  if(i2cp_parse_payload(&t->payload))
  {
    uint16_t ippkt_sz;
    if(translate_i2cp_to_ip(&t->pkt, &t->payload, t->buf, sizeof(t->buf), &ippkt_sz))
    {
      ringbuf_append(&t->tun.write, t->buf, ippkt_sz);
    }
    else
      printf("dropping i2cp message, cannot translate\n");
  }
  else
  {
    printf("invalid i2cp payload\n");
  }
}